

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<float>_>::Decompose_LDLt(TPZMatrix<std::complex<float>_> *this)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float __z;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float extraout_XMM0_Db_06;
  undefined8 uVar7;
  float extraout_XMM0_Db_07;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  float extraout_XMM0_Dc_03;
  float extraout_XMM0_Dc_04;
  float extraout_XMM0_Dc_05;
  float extraout_XMM0_Dc_06;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float extraout_XMM0_Dd_04;
  float extraout_XMM0_Dd_05;
  float extraout_XMM0_Dd_06;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  complex<float> val;
  ulong local_d0;
  float local_c8;
  float fStack_c4;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  ulong local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  ulong local_70;
  float local_68;
  undefined4 uStack_64;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  lVar5 = (this->super_TPZBaseMatrix).fRow;
  if (lVar5 != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
    lVar5 = (this->super_TPZBaseMatrix).fRow;
  }
  if (0 < (int)(uint)lVar5) {
    uVar6 = (ulong)((uint)lVar5 & 0x7fffffff);
    local_90 = 1;
    uVar3 = 0;
    do {
      if (uVar3 == 0) {
        local_c8 = 0.0;
        fStack_c4 = 0.0;
        uStack_c0 = 0;
      }
      else {
        local_c8 = 0.0;
        fStack_c4 = 0.0;
        uStack_c0 = 0;
        uVar4 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar4,uVar4);
          local_88 = extraout_XMM0_Da;
          fStack_84 = extraout_XMM0_Db;
          fStack_80 = extraout_XMM0_Dc;
          fStack_7c = extraout_XMM0_Dd;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar4,uVar3);
          fStack_a4 = fStack_84 * extraout_XMM0_Db_00;
          local_a8 = fStack_a4 + local_88 * extraout_XMM0_Da_00;
          fStack_b4 = local_88 * extraout_XMM0_Db_00;
          fStack_b0 = fStack_80 * extraout_XMM0_Dc_00;
          fStack_ac = fStack_7c * extraout_XMM0_Dd_00;
          local_b8 = fStack_84 * extraout_XMM0_Da_00 - fStack_b4;
          fStack_a0 = fStack_a4;
          fStack_9c = fStack_a4;
          uVar7 = CONCAT44(local_b8,local_a8);
          if ((NAN(local_a8)) && (uVar7 = CONCAT44(local_b8,local_a8), NAN(local_b8))) {
            uVar7 = __mulsc3(local_88,fStack_84,extraout_XMM0_Da_00,-extraout_XMM0_Db_00);
            fStack_b4 = (float)((ulong)uVar7 >> 0x20);
            fStack_b0 = fStack_b4;
            fStack_ac = fStack_b4;
            fStack_a4 = fStack_b4;
            fStack_a0 = extraout_XMM0_Dc_02;
            fStack_9c = extraout_XMM0_Dd_02;
          }
          local_b8 = (float)((ulong)uVar7 >> 0x20);
          local_a8 = (float)uVar7;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar4,uVar3);
          fVar8 = local_a8 * extraout_XMM0_Da_01 - extraout_XMM0_Db_01 * local_b8;
          fVar9 = local_a8 * extraout_XMM0_Dc_01 - extraout_XMM0_Dc_01 * local_b8;
          fVar10 = local_a8 * extraout_XMM0_Dd_01 - extraout_XMM0_Dd_01 * local_b8;
          fVar11 = extraout_XMM0_Da_01 * local_b8 + local_a8 * extraout_XMM0_Db_01;
          uVar7 = CONCAT44(fVar11,fVar8);
          if ((NAN(fVar8)) && (uVar7 = CONCAT44(fVar11,fVar8), NAN(fVar11))) {
            uVar7 = __mulsc3(local_a8,local_b8,extraout_XMM0_Da_01,extraout_XMM0_Db_01);
            fVar9 = extraout_XMM0_Dc_03;
            fVar10 = extraout_XMM0_Dd_03;
          }
          local_c8 = local_c8 + (float)uVar7;
          fStack_c4 = fStack_c4 + (float)((ulong)uVar7 >> 0x20);
          uStack_c0 = CONCAT44(uStack_c0._4_4_ + fVar10,(float)uStack_c0 + fVar9);
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar3,uVar3);
      local_d0 = CONCAT44(extraout_XMM0_Db_02 - fStack_c4,extraout_XMM0_Da_02 - local_c8);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,uVar3,uVar3,&local_d0);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar3,uVar3);
      local_68 = __z;
      uStack_64 = extraout_XMM0_Db_03;
      fVar9 = cabsf(__z);
      if (ABS(fVar9) < 1e-07) {
        Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
      }
      local_70 = uVar3 + 1;
      if (local_70 < uVar6) {
        local_58 = uStack_64;
        uStack_54 = uStack_64;
        uStack_50 = uStack_64;
        uStack_4c = uStack_64;
        uVar4 = local_90;
        do {
          if (uVar3 == 0) {
            local_b8 = 0.0;
            local_c8 = 0.0;
          }
          else {
            local_c8 = 0.0;
            uVar2 = 0;
            local_b8 = 0.0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,uVar2,uVar2);
              local_48 = extraout_XMM0_Da_03;
              fStack_44 = extraout_XMM0_Db_04;
              fStack_40 = extraout_XMM0_Dc_04;
              fStack_3c = extraout_XMM0_Dd_04;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,uVar3,uVar2);
              fStack_84 = fStack_44 * extraout_XMM0_Db_05;
              local_88 = fStack_84 + local_48 * extraout_XMM0_Da_04;
              fStack_a4 = local_48 * extraout_XMM0_Db_05;
              fStack_a0 = fStack_40 * extraout_XMM0_Dc_05;
              fStack_9c = fStack_3c * extraout_XMM0_Dd_05;
              local_a8 = fStack_44 * extraout_XMM0_Da_04 - fStack_a4;
              fStack_80 = fStack_84;
              fStack_7c = fStack_84;
              uVar7 = CONCAT44(local_a8,local_88);
              if ((NAN(local_88)) && (uVar7 = CONCAT44(local_a8,local_88), NAN(local_a8))) {
                uVar7 = __mulsc3(local_48,fStack_44,extraout_XMM0_Da_04,-extraout_XMM0_Db_05);
                fStack_a4 = (float)((ulong)uVar7 >> 0x20);
                fStack_a0 = fStack_a4;
                fStack_9c = fStack_a4;
                fStack_84 = fStack_a4;
                fStack_80 = extraout_XMM0_Dc_06;
                fStack_7c = extraout_XMM0_Dd_06;
              }
              local_a8 = (float)((ulong)uVar7 >> 0x20);
              local_88 = (float)uVar7;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,uVar4,uVar2);
              fVar9 = local_88 * extraout_XMM0_Da_05 - local_a8 * extraout_XMM0_Db_06;
              fVar10 = local_a8 * extraout_XMM0_Da_05 + local_88 * extraout_XMM0_Db_06;
              uVar7 = CONCAT44(fVar10,fVar9);
              if ((NAN(fVar9)) && (uVar7 = CONCAT44(fVar10,fVar9), NAN(fVar10))) {
                uVar7 = __mulsc3(local_88);
              }
              local_c8 = local_c8 + (float)((ulong)uVar7 >> 0x20);
              local_b8 = local_b8 + (float)uVar7;
              uVar2 = uVar2 + 1;
            } while (uVar3 != uVar2);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar4,uVar3);
          local_d0 = __divsc3(extraout_XMM0_Da_06 - local_b8,extraout_XMM0_Db_07 - local_c8,local_68
                              ,local_58);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar4,uVar3,&local_d0);
          local_d0 = local_d0 ^ 0x8000000000000000;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar3,uVar4,&local_d0);
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar6);
      }
      local_90 = local_90 + 1;
      uVar3 = local_70;
    } while (local_70 != uVar6);
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}